

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddNestedExtensions
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *filename,
          DescriptorProto *message_type,FileDescriptorProto *value)

{
  bool bVar1;
  int iVar2;
  DescriptorProto *message_type_00;
  FieldDescriptorProto *field;
  int local_38;
  int local_34;
  int i_1;
  int i;
  FileDescriptorProto *value_local;
  DescriptorProto *message_type_local;
  string *filename_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_34 = 0;
  while( true ) {
    iVar2 = DescriptorProto::nested_type_size(message_type);
    if (iVar2 <= local_34) {
      local_38 = 0;
      while( true ) {
        iVar2 = DescriptorProto::extension_size(message_type);
        if (iVar2 <= local_38) {
          return true;
        }
        field = DescriptorProto::extension(message_type,local_38);
        bVar1 = AddExtension(this,filename,field,value);
        if (!bVar1) break;
        local_38 = local_38 + 1;
      }
      return false;
    }
    message_type_00 = DescriptorProto::nested_type(message_type,local_34);
    bVar1 = AddNestedExtensions(this,filename,message_type_00,value);
    if (!bVar1) break;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddNestedExtensions(
    const std::string& filename, const DescriptorProto& message_type,
    Value value) {
  for (int i = 0; i < message_type.nested_type_size(); i++) {
    if (!AddNestedExtensions(filename, message_type.nested_type(i), value))
      return false;
  }
  for (int i = 0; i < message_type.extension_size(); i++) {
    if (!AddExtension(filename, message_type.extension(i), value)) return false;
  }
  return true;
}